

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngwrite.c
# Opt level: O0

int png_write_image_16bit(png_voidp argument)

{
  ushort uVar1;
  int iVar2;
  undefined8 *puVar3;
  png_const_structrp png_ptr_00;
  ushort *puVar4;
  png_uint_16p ppVar5;
  png_uint_32 pVar6;
  ushort local_6e;
  png_uint_32 calc;
  int iStack_68;
  png_uint_16 component;
  int c;
  png_uint_32 reciprocal;
  png_uint_16 alpha;
  png_uint_16p out_ptr;
  png_const_uint_16p in_ptr;
  png_uint_32 local_48;
  png_uint_32 y;
  int aindex;
  uint channels;
  png_uint_16p row_end;
  png_uint_16p output_row;
  png_const_uint_16p input_row;
  png_structrp png_ptr;
  png_imagep image;
  png_image_write_control *display;
  png_voidp argument_local;
  
  puVar3 = *argument;
  png_ptr_00 = *(png_const_structrp *)*puVar3;
  output_row = *(png_uint_16p *)((long)argument + 0x28);
  row_end = *(png_uint_16p *)((long)argument + 0x38);
  pVar6 = 1;
  if ((*(uint *)((long)puVar3 + 0x14) & 2) != 0) {
    pVar6 = 3;
  }
  in_ptr._4_4_ = *(int *)(puVar3 + 2);
  if ((*(uint *)((long)puVar3 + 0x14) & 1) == 0) {
    png_error(png_ptr_00,"png_write_image: internal call error");
  }
  local_48 = pVar6;
  if ((*(uint *)((long)puVar3 + 0x14) & 0x20) != 0) {
    local_48 = 0xffffffff;
    output_row = output_row + 1;
    row_end = row_end + 1;
  }
  iVar2 = *(int *)((long)puVar3 + 0xc);
  for (; in_ptr._4_4_ != 0; in_ptr._4_4_ = in_ptr._4_4_ + -1) {
    out_ptr = output_row;
    for (_reciprocal = row_end; _reciprocal < row_end + iVar2 * (pVar6 + 1);
        _reciprocal = _reciprocal + 2) {
      uVar1 = out_ptr[(int)local_48];
      iStack_68 = 0;
      _reciprocal[(int)local_48] = uVar1;
      calc = pVar6;
      puVar4 = _reciprocal;
      ppVar5 = out_ptr;
      if ((uVar1 != 0) && (uVar1 != 0xffff)) {
        iStack_68 = (((int)(uint)uVar1 >> 1) + 0x7fff8000) / (int)(uint)uVar1;
      }
      do {
        out_ptr = ppVar5;
        _reciprocal = puVar4;
        local_6e = *out_ptr;
        if (local_6e < uVar1) {
          if ((local_6e != 0) && (uVar1 != 0xffff)) {
            local_6e = (ushort)((uint)local_6e * iStack_68 + 0x4000 >> 0xf);
          }
        }
        else {
          local_6e = 0xffff;
        }
        *_reciprocal = local_6e;
        calc = calc - 1;
        puVar4 = _reciprocal + 1;
        ppVar5 = out_ptr + 1;
      } while (0 < (int)calc);
      out_ptr = out_ptr + 2;
    }
    png_write_row(png_ptr_00,*(png_const_bytep *)((long)argument + 0x38));
    output_row = (png_uint_16p)((*(ulong *)((long)argument + 0x30) & 0xfffe) + (long)output_row);
  }
  return 1;
}

Assistant:

static int
png_write_image_16bit(png_voidp argument)
{
   png_image_write_control *display = png_voidcast(png_image_write_control*,
       argument);
   png_imagep image = display->image;
   png_structrp png_ptr = image->opaque->png_ptr;

   png_const_uint_16p input_row = png_voidcast(png_const_uint_16p,
       display->first_row);
   png_uint_16p output_row = png_voidcast(png_uint_16p, display->local_row);
   png_uint_16p row_end;
   unsigned int channels = (image->format & PNG_FORMAT_FLAG_COLOR) != 0 ?
       3 : 1;
   int aindex = 0;
   png_uint_32 y = image->height;

   if ((image->format & PNG_FORMAT_FLAG_ALPHA) != 0)
   {
#   ifdef PNG_SIMPLIFIED_WRITE_AFIRST_SUPPORTED
      if ((image->format & PNG_FORMAT_FLAG_AFIRST) != 0)
      {
         aindex = -1;
         ++input_row; /* To point to the first component */
         ++output_row;
      }
         else
            aindex = (int)channels;
#     else
         aindex = (int)channels;
#     endif
   }

   else
      png_error(png_ptr, "png_write_image: internal call error");

   /* Work out the output row end and count over this, note that the increment
    * above to 'row' means that row_end can actually be beyond the end of the
    * row; this is correct.
    */
   row_end = output_row + image->width * (channels+1);

   for (; y > 0; --y)
   {
      png_const_uint_16p in_ptr = input_row;
      png_uint_16p out_ptr = output_row;

      while (out_ptr < row_end)
      {
         png_uint_16 alpha = in_ptr[aindex];
         png_uint_32 reciprocal = 0;
         int c;

         out_ptr[aindex] = alpha;

         /* Calculate a reciprocal.  The correct calculation is simply
          * component/alpha*65535 << 15. (I.e. 15 bits of precision); this
          * allows correct rounding by adding .5 before the shift.  'reciprocal'
          * is only initialized when required.
          */
         if (alpha > 0 && alpha < 65535)
            reciprocal = ((0xffff<<15)+(alpha>>1))/alpha;

         c = (int)channels;
         do /* always at least one channel */
         {
            png_uint_16 component = *in_ptr++;

            /* The following gives 65535 for an alpha of 0, which is fine,
             * otherwise if 0/0 is represented as some other value there is more
             * likely to be a discontinuity which will probably damage
             * compression when moving from a fully transparent area to a
             * nearly transparent one.  (The assumption here is that opaque
             * areas tend not to be 0 intensity.)
             */
            if (component >= alpha)
               component = 65535;

            /* component<alpha, so component/alpha is less than one and
             * component*reciprocal is less than 2^31.
             */
            else if (component > 0 && alpha < 65535)
            {
               png_uint_32 calc = component * reciprocal;
               calc += 16384; /* round to nearest */
               component = (png_uint_16)(calc >> 15);
            }

            *out_ptr++ = component;
         }
         while (--c > 0);

         /* Skip to next component (skip the intervening alpha channel) */
         ++in_ptr;
         ++out_ptr;
      }

      png_write_row(png_ptr, png_voidcast(png_const_bytep, display->local_row));
      input_row += (png_uint_16)display->row_bytes/(sizeof (png_uint_16));
   }

   return 1;
}